

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize
          (BerdySparseMAPSolverPimpl *this)

{
  BerdyHelper *this_00;
  bool bVar1;
  size_t rows;
  size_t sVar2;
  size_t sVar3;
  Triplets identityTriplets;
  void *local_88;
  undefined8 uStack_80;
  long local_78;
  JointDOFsDoubleArray *local_68;
  JointPosDoubleArray *local_60;
  Vector3 local_58;
  FrameIndex local_38;
  
  this->valid = false;
  bVar1 = BerdyHelper::isValid(this->berdy);
  if (bVar1) {
    rows = BerdyHelper::getNrOfDynamicVariables(this->berdy);
    sVar2 = BerdyHelper::getNrOfDynamicEquations(this->berdy);
    sVar3 = BerdyHelper::getNrOfSensorsMeasurements(this->berdy);
    BerdyHelper::model(this->berdy);
    iDynTree::JointPosDoubleArray::resize((Model *)&this->jointsConfiguration);
    local_60 = &this->jointsConfiguration;
    iDynTree::VectorDynSize::zero();
    BerdyHelper::model(this->berdy);
    iDynTree::JointDOFsDoubleArray::resize((Model *)&this->jointsVelocity);
    local_68 = &this->jointsVelocity;
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->measurements);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsAPosteriori);
    iDynTree::VectorDynSize::zero();
    Eigen::SparseMatrix<double,_0,_int>::resize
              (&this->covarianceDynamicsAPosterioriInverse,rows,rows);
    Eigen::SparseMatrix<double,_0,_int>::resize(&this->covarianceDynamicsPriorInverse,rows,rows);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsPrior);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsPriorRHS);
    iDynTree::VectorDynSize::resize((ulong)&this->expectedDynamicsAPosterioriRHS);
    iDynTree::VectorDynSize::zero();
    local_88 = (void *)0x0;
    uStack_80 = 0;
    local_78 = 0;
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorDynamicsConstraintsCovarianceInverse,sVar2);
    iDynTree::Triplets::reserve((ulong)&local_88);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&local_88,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorDynamicsConstraintsCovarianceInverse);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorDynamicsRegularizationCovarianceInverse,rows);
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&local_88);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&local_88,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorDynamicsRegularizationCovarianceInverse);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::resize
              ((ulong)&this->priorMeasurementsCovarianceInverse,sVar3);
    iDynTree::Triplets::clear();
    iDynTree::Triplets::reserve((ulong)&local_88);
    iDynTree::Triplets::setDiagonalMatrix((ulong)&local_88,0,1.0,0);
    iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromTriplets
              ((Triplets *)&this->priorMeasurementsCovarianceInverse);
    iDynTree::VectorDynSize::resize((ulong)&this->priorDynamicsRegularizationExpectedValue);
    iDynTree::VectorDynSize::zero();
    local_58.m_data[0] = 0.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = -9.81;
    this_00 = this->berdy;
    BerdyHelper::dynamicTraversal(this_00);
    iDynTree::Traversal::getBaseLink();
    local_38 = iDynTree::Link::getIndex();
    BerdyHelper::updateKinematicsFromFixedBase(this_00,local_60,local_68,&local_38,&local_58);
    computeMAP(this,true);
    this->valid = true;
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
  }
  return bVar1;
}

Assistant:

bool BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::initialize()
    {
        valid = false;
        if (!berdy.isValid()) return false;
        // Resize internal variables
        size_t numberOfDynVariables = berdy.getNrOfDynamicVariables();
        size_t numberOfDynEquations = berdy.getNrOfDynamicEquations();
        size_t numberOfMeasurements = berdy.getNrOfSensorsMeasurements();

        jointsConfiguration.resize(berdy.model());
        jointsConfiguration.zero();
        jointsVelocity.resize(berdy.model());
        jointsVelocity.zero();

        measurements.resize(numberOfMeasurements);
        measurements.zero();

        expectedDynamicsAPosteriori.resize(numberOfDynVariables);
        expectedDynamicsAPosteriori.zero();
        covarianceDynamicsAPosterioriInverse.resize(numberOfDynVariables, numberOfDynVariables);

        covarianceDynamicsPriorInverse.resize(numberOfDynVariables, numberOfDynVariables);
        expectedDynamicsPrior.resize(numberOfDynVariables);
        expectedDynamicsPriorRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.resize(numberOfDynVariables);
        expectedDynamicsAPosterioriRHS.zero();

        // Resize priors and set them to identity.
        // If a prior is specified in config file they will be cleared after
        iDynTree::Triplets identityTriplets;
        priorDynamicsConstraintsCovarianceInverse.resize(numberOfDynEquations, numberOfDynEquations);
        identityTriplets.reserve(numberOfDynEquations);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynEquations);
        priorDynamicsConstraintsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationCovarianceInverse.resize(numberOfDynVariables, numberOfDynVariables);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfDynVariables);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfDynVariables);
        priorDynamicsRegularizationCovarianceInverse.setFromTriplets(identityTriplets);

        priorMeasurementsCovarianceInverse.resize(numberOfMeasurements, numberOfMeasurements);
        identityTriplets.clear();
        identityTriplets.reserve(numberOfMeasurements);
        identityTriplets.setDiagonalMatrix(0, 0, 1.0, numberOfMeasurements);
        priorMeasurementsCovarianceInverse.setFromTriplets(identityTriplets);

        priorDynamicsRegularizationExpectedValue.resize(numberOfDynVariables);
        priorDynamicsRegularizationExpectedValue.zero();

        Vector3 initialGravity;
        initialGravity.zero();
        initialGravity(2) = -9.81;

        berdy.updateKinematicsFromFixedBase(jointsConfiguration, jointsVelocity, berdy.dynamicTraversal().getBaseLink()->getIndex(), initialGravity);
        computeMAP(true);

        valid = true;
        return true;
    }